

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

bool __thiscall LinearGE<1,_0>::propagate(LinearGE<1,_0> *this)

{
  uint uVar1;
  uint uVar2;
  IntView<2> *pIVar3;
  IntView<3> *pIVar4;
  int iVar5;
  uint uVar6;
  Clause *pCVar7;
  int *piVar8;
  ulong uVar9;
  Lit *pLVar10;
  uint uVar11;
  long lVar12;
  size_t sVar13;
  IntVar *pIVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  int64_t iVar18;
  Clause *local_48;
  vec<Lit> *local_40;
  ulong local_38;
  
  iVar18 = this->fix_sum;
  uVar6 = (this->x).sz;
  uVar16 = (ulong)uVar6;
  uVar1 = this->fix_x;
  uVar17 = (ulong)uVar1;
  if (uVar1 < uVar6) {
    piVar8 = &(this->x).data[uVar17].a;
    lVar12 = uVar16 - uVar17;
    do {
      iVar18 = iVar18 + (long)*piVar8 * (long)(((IntView<2> *)(piVar8 + -2))->var->max).v;
      piVar8 = piVar8 + 4;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  uVar2 = (this->y).sz;
  uVar9 = (ulong)uVar2;
  uVar11 = this->fix_y;
  if (uVar11 < uVar2) {
    lVar12 = uVar9 - uVar11;
    piVar8 = &(this->y).data[uVar11].a;
    do {
      iVar18 = iVar18 + (long)*piVar8 * -(long)(((IntView<3> *)(piVar8 + -2))->var->min).v;
      piVar8 = piVar8 + 4;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  if (uVar1 < uVar6) {
    local_40 = &this->ps;
    do {
      pIVar3 = (this->x).data;
      pIVar14 = pIVar3[uVar17].var;
      lVar12 = (long)pIVar3[uVar17].a;
      lVar15 = (pIVar14->max).v * lVar12 - iVar18;
      if ((pIVar14->min).v * lVar12 < lVar15) {
        if (so.lazy == true) {
          local_38 = uVar17;
          if ((int)uVar16 != 0) {
            lVar12 = 0;
            uVar16 = 0;
            do {
              iVar5 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar12) + 0x48))();
              (this->ps).data[uVar16].x = iVar5;
              uVar16 = uVar16 + 1;
              lVar12 = lVar12 + 0x10;
            } while (uVar16 < (this->x).sz);
          }
          if ((this->y).sz == 0) {
            pLVar10 = (this->ps).data;
          }
          else {
            lVar12 = 0;
            uVar16 = 0;
            do {
              iVar5 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar12) + 0x40))();
              pLVar10 = (this->ps).data;
              pLVar10[(this->x).sz + (int)uVar16].x = iVar5;
              uVar16 = uVar16 + 1;
              lVar12 = lVar12 + 0x10;
            } while (uVar16 < (this->y).sz);
          }
          uVar16 = local_38;
          pLVar10[local_38].x = pLVar10->x;
          uVar6 = (this->ps).sz;
          sVar13 = (ulong)(uVar6 - 1) * 4 + 8;
          if (uVar6 == 0) {
            sVar13 = 8;
          }
          pCVar7 = (Clause *)malloc(sVar13);
          Clause::Clause<vec<Lit>>(pCVar7,local_40,false);
          *(byte *)pCVar7 = *(byte *)pCVar7 | 2;
          local_48 = pCVar7;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_48);
          pIVar3 = (this->x).data;
          lVar12 = (long)pIVar3[uVar17].a;
          pIVar14 = pIVar3[uVar17].var;
          pCVar7 = local_48;
          uVar17 = uVar16;
        }
        else {
          pCVar7 = (Clause *)0x0;
        }
        lVar15 = lVar15 + -1;
        iVar5 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[0xe])
                          (pIVar14,lVar15 / lVar12 + (lVar15 % lVar12 >> 0x3f) + 1,pCVar7,1);
        if ((char)iVar5 == '\0') {
          return false;
        }
        uVar16 = (ulong)(this->x).sz;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < uVar16);
    uVar9 = (ulong)(this->y).sz;
    uVar11 = this->fix_y;
  }
  if (uVar11 < (uint)uVar9) {
    local_40 = &this->ps;
    uVar17 = (ulong)uVar11;
    do {
      pIVar4 = (this->y).data;
      pIVar14 = pIVar4[uVar17].var;
      lVar12 = (long)pIVar4[uVar17].a;
      lVar15 = -(long)(pIVar14->min).v * lVar12 - iVar18;
      if (-(long)(pIVar14->max).v * lVar12 < lVar15) {
        if (so.lazy == true) {
          local_38 = uVar17 * 0x10;
          if ((this->x).sz == 0) {
            uVar6 = 0;
          }
          else {
            lVar12 = 0;
            uVar16 = 0;
            do {
              iVar5 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar12) + 0x48))();
              (this->ps).data[uVar16].x = iVar5;
              uVar16 = uVar16 + 1;
              uVar6 = (this->x).sz;
              lVar12 = lVar12 + 0x10;
            } while (uVar16 < uVar6);
            uVar9 = (ulong)(this->y).sz;
          }
          if ((int)uVar9 == 0) {
            pLVar10 = (this->ps).data;
          }
          else {
            lVar12 = 0;
            uVar16 = 0;
            do {
              iVar5 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar12) + 0x40))();
              pLVar10 = (this->ps).data;
              pLVar10[(this->x).sz + (int)uVar16].x = iVar5;
              uVar16 = uVar16 + 1;
              lVar12 = lVar12 + 0x10;
            } while (uVar16 < (this->y).sz);
            uVar6 = (this->x).sz;
          }
          pLVar10[uVar6 + (int)uVar17].x = pLVar10->x;
          uVar6 = (this->ps).sz;
          sVar13 = (ulong)(uVar6 - 1) * 4 + 8;
          if (uVar6 == 0) {
            sVar13 = 8;
          }
          pCVar7 = (Clause *)malloc(sVar13);
          Clause::Clause<vec<Lit>>(pCVar7,local_40,false);
          *(byte *)pCVar7 = *(byte *)pCVar7 | 2;
          local_48 = pCVar7;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_48);
          pIVar4 = (this->y).data;
          lVar12 = (long)*(int *)((long)&pIVar4->a + local_38);
          pIVar14 = *(IntVar **)((long)&pIVar4->var + local_38);
          pCVar7 = local_48;
        }
        else {
          pCVar7 = (Clause *)0x0;
        }
        lVar15 = lVar15 + -1;
        iVar5 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[0xf])
                          (pIVar14,~(lVar15 / lVar12) - (lVar15 % lVar12 >> 0x3f),pCVar7,1);
        if ((char)iVar5 == '\0') {
          return false;
        }
        uVar9 = (ulong)(this->y).sz;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < uVar9);
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		int64_t max_sum = fix_sum;

		for (unsigned int i = fix_x; i < x.size(); i++) {
			max_sum += x[i].getMax();
		}
		for (unsigned int i = fix_y; i < y.size(); i++) {
			max_sum += y[i].getMax();
		}

		//		if (R && max_sum < 0) setDom2(r, setVal, 0, x.size()+y.size());

		if ((R != 0) && max_sum < 0) {
			const int64_t v = 0;
			if (r.setValNotR(v != 0)) {
				Reason expl;
				if (so.lazy) {
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + 1] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + 1 + x.size()] = y[j].getMaxLit();
					}
					expl = Reason_new(ps);
				}
				if (!r.setVal(v != 0, expl)) {
					return false;
				}
			}
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		//		for (int i = fix_x; i < x.size(); i++) {
		//			setDom2(x[i], setMin, x[i].getMax()-max_sum, i);
		//		}

		//		for (int i = fix_y; i < y.size(); i++) {
		//			setDom2(y[i], setMin, y[i].getMax()-max_sum, x.size()+i);
		//		}

		for (unsigned int i = fix_x; i < x.size(); i++) {
			const int64_t v = x[i].getMax() - max_sum;
			if (x[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!x[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		for (unsigned int i = fix_y; i < y.size(); i++) {
			const int64_t v = y[i].getMax() - max_sum;
			if (y[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + x.size() + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!y[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		return true;
	}